

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::GetPermissions(char *file,mode_t *mode)

{
  allocator local_41;
  string local_40;
  mode_t *local_20;
  mode_t *mode_local;
  char *file_local;
  
  if (file == (char *)0x0) {
    file_local._7_1_ = 0;
  }
  else {
    local_20 = mode;
    mode_local = (mode_t *)file;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,file,&local_41);
    file_local._7_1_ = GetPermissions(&local_40,local_20);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (bool)(file_local._7_1_ & 1);
}

Assistant:

bool SystemTools::GetPermissions(const char* file, mode_t& mode)
{
  if (!file) {
    return false;
  }
  return SystemTools::GetPermissions(std::string(file), mode);
}